

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O3

CURLcode setstropt_interface(char *option,char **devp,char **ifacep,char **hostp)

{
  CURLcode CVar1;
  char *host;
  char *iface;
  char *dev;
  char *local_38;
  char *local_30;
  char *local_28;
  
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  if ((option != (char *)0x0) &&
     (CVar1 = Curl_parse_interface(option,&local_28,&local_30,&local_38), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  (*Curl_cfree)(*devp);
  *devp = local_28;
  (*Curl_cfree)(*ifacep);
  *ifacep = local_30;
  (*Curl_cfree)(*hostp);
  *hostp = local_38;
  return CURLE_OK;
}

Assistant:

static CURLcode setstropt_interface(char *option, char **devp,
                                    char **ifacep, char **hostp)
{
  char *dev = NULL;
  char *iface = NULL;
  char *host = NULL;
  CURLcode result;

  DEBUGASSERT(devp);
  DEBUGASSERT(ifacep);
  DEBUGASSERT(hostp);

  if(option) {
    /* Parse the interface details if set, otherwise clear them all */
    result = Curl_parse_interface(option, &dev, &iface, &host);
    if(result)
      return result;
  }
  free(*devp);
  *devp = dev;

  free(*ifacep);
  *ifacep = iface;

  free(*hostp);
  *hostp = host;

  return CURLE_OK;
}